

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O1

int bcf_sr_set_samples(bcf_srs_t *files,char *fname,int is_file)

{
  uint uVar1;
  bcf_hdr_t *pbVar2;
  bcf_sr_t *pbVar3;
  char cVar4;
  int iVar5;
  khint_t kVar6;
  uint uVar7;
  int iVar8;
  char **__ptr;
  char **ppcVar9;
  char *pcVar10;
  int *piVar11;
  byte bVar12;
  char *pcVar13;
  uint uVar14;
  kh_str2int_t *hash_2;
  kh_str2int_t *h;
  khint32_t *pkVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  int nsmpl;
  kh_str2int_t *hash;
  int ret;
  int local_70;
  undefined4 local_6c;
  kh_str2int_t *local_68;
  ulong local_60;
  uint local_58;
  int local_54;
  bcf_srs_t *local_50;
  char **local_48;
  long local_40;
  khint32_t *local_38;
  
  if (*fname == '^') {
    local_68 = (kh_str2int_t *)calloc(1,0x28);
  }
  else {
    local_68 = (kh_str2int_t *)0x0;
  }
  if ((local_68 == (kh_str2int_t *)0x0) && (iVar5 = strcmp("-",fname), iVar5 == 0)) {
    local_6c = 1;
    __ptr = (char **)0x0;
    h = local_68;
  }
  else {
    __ptr = hts_readlist(fname,is_file,&local_70);
    h = local_68;
    if (__ptr == (char **)0x0) {
      fprintf(_stderr,"Could not read the file: \"%s\"\n",fname);
      return 0;
    }
    if ((local_68 != (kh_str2int_t *)0x0) && (0 < local_70)) {
      lVar17 = 0;
      do {
        kVar6 = kh_put_str2int(h,__ptr[lVar17],&local_54);
        if (local_54 != 0) {
          h->vals[kVar6] = h->size - 1;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < local_70);
    }
    local_6c = 0;
  }
  if (__ptr == (char **)0x0) {
    pbVar2 = files->readers->header;
    __ptr = pbVar2->samples;
    local_70 = pbVar2->n[2];
  }
  files->samples = (char **)0x0;
  files->n_smpl = 0;
  if (0 < local_70) {
    lVar17 = 0;
    local_50 = files;
    local_48 = __ptr;
    do {
      if (h == (kh_str2int_t *)0x0) {
LAB_00116004:
        if (files->nreaders < 1) {
          uVar18 = 0;
        }
        else {
          lVar20 = 0x18;
          uVar18 = 0;
          do {
            iVar5 = bcf_hdr_id2int(*(bcf_hdr_t **)((long)&files->readers->file + lVar20),2,
                                   __ptr[lVar17]);
            if (iVar5 < 0) break;
            uVar18 = uVar18 + 1;
            lVar20 = lVar20 + 0x60;
          } while ((long)uVar18 < (long)files->nreaders);
        }
        if ((int)uVar18 == files->nreaders) {
          ppcVar9 = (char **)realloc(files->samples,(long)files->n_smpl * 8 + 8);
          files->samples = ppcVar9;
          pcVar10 = strdup(__ptr[lVar17]);
          iVar5 = files->n_smpl;
          files->n_smpl = iVar5 + 1;
          ppcVar9[iVar5] = pcVar10;
        }
        else {
          fprintf(_stderr,"Warning: The sample \"%s\" was not found in %s, skipping\n",__ptr[lVar17]
                  ,files->readers[uVar18 & 0xffffffff].fname);
        }
      }
      else {
        uVar7 = h->n_buckets;
        if (uVar7 == 0) {
          uVar7 = 0;
          uVar19 = 0;
        }
        else {
          pcVar10 = __ptr[lVar17];
          uVar16 = (uint)*pcVar10;
          if (*pcVar10 == '\0') {
            uVar16 = 0;
          }
          else {
            cVar4 = pcVar10[1];
            if (cVar4 != '\0') {
              pcVar13 = pcVar10 + 2;
              do {
                uVar16 = (int)cVar4 + uVar16 * 0x1f;
                cVar4 = *pcVar13;
                pcVar13 = pcVar13 + 1;
              } while (cVar4 != '\0');
            }
          }
          uVar14 = uVar7 - 1;
          uVar16 = uVar16 & uVar14;
          pkVar15 = h->flags;
          iVar5 = 1;
          uVar19 = uVar16;
          local_60 = (ulong)uVar7;
          local_58 = uVar14;
          local_40 = lVar17;
          local_38 = pkVar15;
          do {
            uVar1 = pkVar15[uVar19 >> 4];
            bVar12 = (char)uVar19 * '\x02' & 0x1e;
            uVar7 = uVar1 >> bVar12;
            if (((uVar7 & 2) != 0) ||
               (((uVar7 & 1) == 0 &&
                (iVar8 = strcmp(local_68->keys[uVar19],pcVar10), pkVar15 = local_38,
                uVar14 = local_58, iVar8 == 0)))) {
              uVar7 = (uint)local_60;
              files = local_50;
              h = local_68;
              __ptr = local_48;
              lVar17 = local_40;
              if ((uVar1 >> bVar12 & 3) != 0) {
                uVar19 = uVar7;
              }
              goto LAB_00115fff;
            }
            uVar19 = uVar19 + iVar5 & uVar14;
            iVar5 = iVar5 + 1;
          } while (uVar19 != uVar16);
          uVar7 = (uint)local_60;
          files = local_50;
          h = local_68;
          __ptr = local_48;
          lVar17 = local_40;
          uVar19 = uVar7;
        }
LAB_00115fff:
        if (uVar19 == uVar7) goto LAB_00116004;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < local_70);
  }
  if (h != (kh_str2int_t *)0x0) {
    free(h->keys);
    free(h->flags);
    free(h->vals);
    free(h);
  }
  if ((char)local_6c == '\0') {
    if (0 < local_70) {
      lVar17 = 0;
      do {
        free(__ptr[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 < local_70);
    }
    free(__ptr);
  }
  if (files->n_smpl == 0) {
    iVar5 = 0;
    if (1 < files->nreaders) {
      bcf_sr_set_samples_cold_1();
      iVar5 = 0;
    }
  }
  else {
    iVar5 = 1;
    if (0 < files->nreaders) {
      lVar17 = 0;
      do {
        pbVar3 = files->readers;
        iVar8 = files->n_smpl;
        piVar11 = (int *)malloc((long)iVar8 << 2);
        pbVar3[lVar17].samples = piVar11;
        pbVar3[lVar17].n_smpl = iVar8;
        if (0 < files->n_smpl) {
          lVar20 = 0;
          do {
            iVar8 = bcf_hdr_id2int(pbVar3[lVar17].header,2,files->samples[lVar20]);
            pbVar3[lVar17].samples[lVar20] = iVar8;
            lVar20 = lVar20 + 1;
          } while (lVar20 < files->n_smpl);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < files->nreaders);
    }
  }
  return iVar5;
}

Assistant:

int bcf_sr_set_samples(bcf_srs_t *files, const char *fname, int is_file)
{
    int i, j, nsmpl, free_smpl = 0;
    char **smpl = NULL;

    void *exclude = (fname[0]=='^') ? khash_str2int_init() : NULL;
    if ( exclude || strcmp("-",fname) ) // "-" stands for all samples
    {
        smpl = hts_readlist(fname, is_file, &nsmpl);
        if ( !smpl )
        {
            fprintf(stderr,"Could not read the file: \"%s\"\n", fname);
            return 0;
        }
        if ( exclude )
        {
            for (i=0; i<nsmpl; i++)
                khash_str2int_inc(exclude, smpl[i]);
        }
        free_smpl = 1;
    }
    if ( !smpl )
    {
        smpl  = files->readers[0].header->samples;   // intersection of all samples
        nsmpl = bcf_hdr_nsamples(files->readers[0].header);
    }

    files->samples = NULL;
    files->n_smpl  = 0;
    for (i=0; i<nsmpl; i++)
    {
        if ( exclude && khash_str2int_has_key(exclude,smpl[i])  ) continue;

        int n_isec = 0;
        for (j=0; j<files->nreaders; j++)
        {
            if ( bcf_hdr_id2int(files->readers[j].header, BCF_DT_SAMPLE, smpl[i])<0 ) break;
            n_isec++;
        }
        if ( n_isec!=files->nreaders )
        {
            fprintf(stderr,"Warning: The sample \"%s\" was not found in %s, skipping\n", smpl[i], files->readers[n_isec].fname);
            continue;
        }

        files->samples = (char**) realloc(files->samples, (files->n_smpl+1)*sizeof(const char*));
        files->samples[files->n_smpl++] = strdup(smpl[i]);
    }

    if ( exclude ) khash_str2int_destroy(exclude);
    if ( free_smpl )
    {
        for (i=0; i<nsmpl; i++) free(smpl[i]);
        free(smpl);
    }

    if ( !files->n_smpl )
    {
        if ( files->nreaders>1 )
            fprintf(stderr,"No samples in common.\n");
        return 0;
    }
    for (i=0; i<files->nreaders; i++)
    {
        bcf_sr_t *reader = &files->readers[i];
        reader->samples  = (int*) malloc(sizeof(int)*files->n_smpl);
        reader->n_smpl   = files->n_smpl;
        for (j=0; j<files->n_smpl; j++)
            reader->samples[j] = bcf_hdr_id2int(reader->header, BCF_DT_SAMPLE, files->samples[j]);
    }
    return 1;
}